

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_endpoint.hpp
# Opt level: O2

void __thiscall
canary::basic_endpoint<canary::raw>::resize(basic_endpoint<canary::raw> *this,size_t n)

{
  system_error *this_00;
  error_code ec;
  
  if (n < 0x19) {
    return;
  }
  ec = boost::asio::error::make_error_code(invalid_argument);
  this_00 = (system_error *)__cxa_allocate_exception(0x40);
  boost::system::system_error::system_error(this_00,ec);
  __cxa_throw(this_00,&boost::system::system_error::typeinfo,
              boost::system::system_error::~system_error);
}

Assistant:

void resize(std::size_t n)
    {
        if (n > capacity())
        {
            error_code ec{net::error::invalid_argument};
            throw system_error{ec};
        }
    }